

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

void insert_to_bucket(hashtable_t *hashtable,bucket_t *bucket,list_t *list)

{
  int iVar1;
  list_t *list_local;
  bucket_t *bucket_local;
  hashtable_t *hashtable_local;
  
  iVar1 = bucket_is_empty(hashtable,bucket);
  if (iVar1 == 0) {
    list_insert(bucket->first,list);
    bucket->first = list;
  }
  else {
    list_insert(&hashtable->list,list);
    bucket->last = list;
    bucket->first = list;
  }
  return;
}

Assistant:

static void insert_to_bucket(hashtable_t *hashtable, bucket_t *bucket, list_t *list) {
    if (bucket_is_empty(hashtable, bucket)) {
        list_insert(&hashtable->list, list);
        bucket->first = bucket->last = list;
    } else {
        list_insert(bucket->first, list);
        bucket->first = list;
    }
}